

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void showToolTip(QHelpEvent *helpEvent,QWidget *widget,QStyleOptionComplex *opt,
                ComplexControl complexControl,SubControl subControl)

{
  QRect QVar1;
  QRect QVar2;
  QRect QVar3;
  bool bVar4;
  int iVar5;
  QStyle *pQVar6;
  long lVar7;
  long in_FS_OFFSET;
  undefined1 local_68 [16];
  qsizetype qStack_58;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = QWidget::style(widget);
  iVar5 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x70,opt,widget,0);
  QVar3.x2.m_i = local_68._8_4_;
  QVar3.y2.m_i = local_68._12_4_;
  QVar3.x1.m_i = local_68._0_4_;
  QVar3.y1.m_i = local_68._4_4_;
  QVar2.x2.m_i = local_68._8_4_;
  QVar2.y2.m_i = local_68._12_4_;
  QVar2.x1.m_i = local_68._0_4_;
  QVar2.y1.m_i = local_68._4_4_;
  QVar1.x2.m_i = local_68._8_4_;
  QVar1.y2.m_i = local_68._12_4_;
  QVar1.x1.m_i = local_68._0_4_;
  QVar1.y1.m_i = local_68._4_4_;
  if (iVar5 != 0) goto LAB_00448c76;
  if (complexControl == CC_MdiControls) {
    if (subControl == SC_ComboBoxArrow) {
switchD_00448cfc_caseD_8:
      local_48.d.size = 0;
      local_48.d.ptr = (char16_t *)0x0;
      QMetaObject::tr(local_68,(char *)&QMdiSubWindow::staticMetaObject,0x6daff8);
      local_48.d.d = (Data *)local_68._0_8_;
      local_48.d.ptr = (char16_t *)local_68._8_8_;
      local_48.d.size = qStack_58;
      subControl = SC_ComboBoxListBoxPopup;
    }
    else if (subControl == SC_ComboBoxEditField) {
LAB_00448dea:
      local_48.d.size = 0;
      local_48.d.ptr = (char16_t *)0x0;
      local_48.d.d = (Data *)0x0;
      bVar4 = QWidget::isMaximized(widget);
      if ((bVar4) ||
         (lVar7 = QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject), lVar7 == 0)) {
        iVar5 = 0x6db0d3;
      }
      else {
        iVar5 = 0x6daf7b;
      }
      QMetaObject::tr(local_68,(char *)&QMdiSubWindow::staticMetaObject,iVar5);
      local_48.d.d = (Data *)local_68._0_8_;
      local_48.d.ptr = (char16_t *)local_68._8_8_;
      local_48.d.size = qStack_58;
      subControl = SC_ScrollBarFirst;
    }
    else {
      QVar1 = QVar2;
      if (subControl != SC_ComboBoxFrame) goto LAB_00448c76;
switchD_00448cfc_caseD_2:
      local_48.d.size = 0;
      local_48.d.ptr = (char16_t *)0x0;
      QMetaObject::tr(local_68,(char *)&QMdiSubWindow::staticMetaObject,0x6db0b3);
      local_48.d.d = (Data *)local_68._0_8_;
      local_48.d.ptr = (char16_t *)local_68._8_8_;
      local_48.d.size = qStack_58;
      subControl = SC_ComboBoxEditField;
    }
  }
  else {
    QVar1 = QVar3;
    if (subControl == SC_None) goto LAB_00448c76;
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (char16_t *)0x0;
    local_48.d.size = 0;
    if ((int)subControl < 0x10) {
      switch(subControl) {
      case SC_ComboBoxFrame:
        QMetaObject::tr(local_68,(char *)&QMdiSubWindow::staticMetaObject,0x660c29);
        local_48.d.d = (Data *)local_68._0_8_;
        local_48.d.ptr = (char16_t *)local_68._8_8_;
        local_48.d.size = qStack_58;
        subControl = SC_ComboBoxFrame;
        break;
      case SC_ComboBoxEditField:
        goto switchD_00448cfc_caseD_2;
      case SC_ComboBoxArrow:
        QMetaObject::tr(local_68,(char *)&QMdiSubWindow::staticMetaObject,0x6db0bc);
        local_48.d.d = (Data *)local_68._0_8_;
        local_48.d.ptr = (char16_t *)local_68._8_8_;
        local_48.d.size = qStack_58;
        subControl = SC_ComboBoxArrow;
        break;
      case SC_ComboBoxListBoxPopup:
        goto switchD_00448cfc_caseD_8;
      }
    }
    else if ((int)subControl < 0x40) {
      if (subControl == SC_ScrollBarFirst) goto LAB_00448dea;
      if (subControl == SC_ScrollBarLast) {
        QMetaObject::tr(local_68,(char *)&QMdiSubWindow::staticMetaObject,0x6db0cd);
        local_48.d.d = (Data *)local_68._0_8_;
        local_48.d.ptr = (char16_t *)local_68._8_8_;
        local_48.d.size = qStack_58;
        subControl = SC_ScrollBarLast;
      }
    }
    else if (subControl == SC_ScrollBarSlider) {
      QMetaObject::tr(local_68,(char *)&QMdiSubWindow::staticMetaObject,0x6db0c5);
      local_48.d.d = (Data *)local_68._0_8_;
      local_48.d.ptr = (char16_t *)local_68._8_8_;
      local_48.d.size = qStack_58;
      subControl = SC_ScrollBarSlider;
    }
    else if (subControl == SC_ScrollBarGroove) {
      QMetaObject::tr(local_68,(char *)&QMdiSubWindow::staticMetaObject,0x6e9881);
      local_48.d.d = (Data *)local_68._0_8_;
      local_48.d.ptr = (char16_t *)local_68._8_8_;
      local_48.d.size = qStack_58;
      subControl = SC_ScrollBarGroove;
    }
  }
  pQVar6 = QWidget::style(widget);
  local_68 = (**(code **)(*(long *)pQVar6 + 0xd8))(pQVar6,complexControl,opt,subControl,widget);
  QToolTip::showText((QPoint *)(helpEvent + 0x18),&local_48,widget,(QRect *)local_68,-1);
  QVar1 = (QRect)local_68;
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      QVar1 = (QRect)local_68;
    }
  }
LAB_00448c76:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  local_68 = (undefined1  [16])QVar1;
  __stack_chk_fail();
}

Assistant:

static void showToolTip(QHelpEvent *helpEvent, QWidget *widget, const QStyleOptionComplex &opt,
                        QStyle::ComplexControl complexControl, QStyle::SubControl subControl)
{
    Q_ASSERT(helpEvent);
    Q_ASSERT(helpEvent->type() == QEvent::ToolTip);
    Q_ASSERT(widget);

    if (widget->style()->styleHint(QStyle::SH_TitleBar_ShowToolTipsOnButtons, &opt, widget))
        return;

    // Convert CC_MdiControls to CC_TitleBar. Sub controls of different complex
    // controls cannot be in the same switch as they might have the same value.
    if (complexControl == QStyle::CC_MdiControls) {
        if (subControl == QStyle::SC_MdiMinButton)
            subControl = QStyle::SC_TitleBarMinButton;
        else if (subControl == QStyle::SC_MdiCloseButton)
            subControl = QStyle::SC_TitleBarCloseButton;
        else if (subControl == QStyle::SC_MdiNormalButton)
            subControl = QStyle::SC_TitleBarNormalButton;
        else
            subControl = QStyle::SC_None;
    }

    // Don't change the tooltip for the base widget itself.
    if (subControl == QStyle::SC_None)
        return;

    QString toolTip;

    switch (subControl) {
    case QStyle::SC_TitleBarMinButton:
        toolTip = QMdiSubWindow::tr("Minimize");
        break;
    case QStyle::SC_TitleBarMaxButton:
        toolTip = QMdiSubWindow::tr("Maximize");
        break;
    case QStyle::SC_TitleBarUnshadeButton:
        toolTip = QMdiSubWindow::tr("Unshade");
        break;
    case QStyle::SC_TitleBarShadeButton:
        toolTip = QMdiSubWindow::tr("Shade");
        break;
    case QStyle::SC_TitleBarNormalButton:
        if (widget->isMaximized() || !qobject_cast<QMdiSubWindow *>(widget))
            toolTip = QMdiSubWindow::tr("Restore Down");
        else
            toolTip = QMdiSubWindow::tr("Restore");
        break;
    case QStyle::SC_TitleBarCloseButton:
        toolTip = QMdiSubWindow::tr("Close");
        break;
    case QStyle::SC_TitleBarContextHelpButton:
        toolTip = QMdiSubWindow::tr("Help");
        break;
    case QStyle::SC_TitleBarSysMenu:
        toolTip = QMdiSubWindow::tr("Menu");
        break;
    default:
        break;
    }

    const QRect rect = widget->style()->subControlRect(complexControl, &opt, subControl, widget);
    QToolTip::showText(helpEvent->globalPos(), toolTip, widget, rect);
}